

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Comparison.cpp
# Opt level: O0

bool CoreML::Specification::operator==(WordEmbedding *a,WordEmbedding *b)

{
  bool bVar1;
  uint32 uVar2;
  uint32 uVar3;
  int iVar4;
  string *psVar5;
  string *__rhs;
  long lVar6;
  long lVar7;
  size_t __n;
  void *__s1;
  void *__s2;
  size_t s;
  WordEmbedding *b_local;
  WordEmbedding *a_local;
  
  uVar2 = CoreMLModels::WordEmbedding::revision(a);
  uVar3 = CoreMLModels::WordEmbedding::revision(b);
  if (uVar2 == uVar3) {
    psVar5 = CoreMLModels::WordEmbedding::language_abi_cxx11_(a);
    __rhs = CoreMLModels::WordEmbedding::language_abi_cxx11_(b);
    bVar1 = std::operator!=(psVar5,__rhs);
    if (bVar1) {
      a_local._7_1_ = false;
    }
    else {
      CoreMLModels::WordEmbedding::modelparameterdata_abi_cxx11_(a);
      lVar6 = std::__cxx11::string::size();
      CoreMLModels::WordEmbedding::modelparameterdata_abi_cxx11_(b);
      lVar7 = std::__cxx11::string::size();
      if (lVar6 == lVar7) {
        CoreMLModels::WordEmbedding::modelparameterdata_abi_cxx11_(a);
        __n = std::__cxx11::string::size();
        if (__n != 0) {
          psVar5 = CoreMLModels::WordEmbedding::modelparameterdata_abi_cxx11_(a);
          __s1 = (void *)std::__cxx11::string::operator[]((ulong)psVar5);
          psVar5 = CoreMLModels::WordEmbedding::modelparameterdata_abi_cxx11_(b);
          __s2 = (void *)std::__cxx11::string::operator[]((ulong)psVar5);
          iVar4 = memcmp(__s1,__s2,__n);
          if (iVar4 != 0) {
            return false;
          }
        }
        a_local._7_1_ = true;
      }
      else {
        a_local._7_1_ = false;
      }
    }
  }
  else {
    a_local._7_1_ = false;
  }
  return a_local._7_1_;
}

Assistant:

bool operator==(const CoreMLModels::WordEmbedding& a,
                        const CoreMLModels::WordEmbedding& b) {
            
            if (a.revision()!= b.revision()) {
                return false;
            }
            
            if (a.language()!= b.language()) {
                return false;
            }
            
            if (a.modelparameterdata().size() != b.modelparameterdata().size()) {
                return false;
            }
            
            size_t s = a.modelparameterdata().size();
            if (s > 0) {
                if (memcmp(&a.modelparameterdata()[0], &b.modelparameterdata()[0], s)) {
                    return false;
                }
            }
            
            return true;
        }